

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultRawMemoryAllocator.cpp
# Opt level: O2

void * __thiscall
Diligent::DefaultRawMemoryAllocator::Allocate
          (DefaultRawMemoryAllocator *this,size_t Size,Char *dbgDescription,char *dbgFileName,
          Int32 dbgLineNumber)

{
  void *pvVar1;
  string msg;
  
  if (Size == 0) {
    FormatString<char[26],char[9]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x66d740,
               (char (*) [9])dbgFileName);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DefaultRawMemoryAllocator.cpp"
               ,0x51);
    std::__cxx11::string::~string((string *)&msg);
  }
  pvVar1 = malloc(Size);
  return pvVar1;
}

Assistant:

void* DefaultRawMemoryAllocator::Allocate(size_t Size, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY_EXPR(Size > 0);
#ifdef USE_CRT_MALLOC_DBG
    return _malloc_dbg(Size, _NORMAL_BLOCK, dbgFileName, dbgLineNumber);
#else
    return malloc(Size);
#endif
}